

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O2

void __thiscall deqp::gles3::Functional::SimpleProgramCase::linkProgram(SimpleProgramCase *this)

{
  CallLogWrapper *this_00;
  GLuint program;
  GLenum err;
  TestError *this_01;
  
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  program = glu::CallLogWrapper::glCreateProgram(this_00);
  if (program != 0) {
    glu::CallLogWrapper::glAttachShader(this_00,program,this->m_vertShader);
    glu::CallLogWrapper::glAttachShader(this_00,program,this->m_fragShader);
    err = glu::CallLogWrapper::glGetError(this_00);
    glu::checkError(err,(char *)0x0,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderApiTests.cpp"
                    ,0x1e8);
    glu::CallLogWrapper::glLinkProgram(this_00,program);
    this->m_program = program;
    return;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,(char *)0x0,"program != 0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderApiTests.cpp"
             ,0x1e4);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void linkProgram (void)
	{
		const GLuint program = glCreateProgram();

		TCU_CHECK(program != 0);

		glAttachShader(program, m_vertShader);
		glAttachShader(program, m_fragShader);
		GLU_CHECK();

		glLinkProgram(program);

		m_program = program;
	}